

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::formatToDecimalQuantity
          (DecimalFormat *this,Formattable *number,DecimalQuantity *output,UErrorCode *status)

{
  LocalizedNumberFormatter *this_00;
  undefined1 local_180 [8];
  UFormattedNumberData obj;
  UErrorCode *status_local;
  DecimalQuantity *output_local;
  Formattable *number_local;
  DecimalFormat *this_local;
  
  obj.string._248_8_ = status;
  icu_63::number::impl::UFormattedNumberData::UFormattedNumberData
            ((UFormattedNumberData *)local_180);
  Formattable::populateDecimalQuantity
            (number,(DecimalQuantity *)&obj,(UErrorCode *)obj.string._248_8_);
  this_00 = LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>::operator->
                      (&(this->fields->formatter).
                        super_LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>);
  icu_63::number::LocalizedNumberFormatter::formatImpl
            (this_00,(UFormattedNumberData *)local_180,(UErrorCode *)obj.string._248_8_);
  icu_63::number::impl::DecimalQuantity::operator=(output,(DecimalQuantity *)&obj);
  icu_63::number::impl::UFormattedNumberData::~UFormattedNumberData
            ((UFormattedNumberData *)local_180);
  return;
}

Assistant:

void DecimalFormat::formatToDecimalQuantity(const Formattable& number, DecimalQuantity& output,
                                            UErrorCode& status) const {
    UFormattedNumberData obj;
    number.populateDecimalQuantity(obj.quantity, status);
    fields->formatter->formatImpl(&obj, status);
    output = std::move(obj.quantity);
}